

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

LY_ERR lyxml_ns_add(lyxml_ctx *xmlctx,char *prefix,size_t prefix_len,char *uri)

{
  lyd_node *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long *object;
  char *pcVar6;
  uint local_3c;
  uint32_t i;
  lyxml_ns *ns;
  char *pcStack_28;
  LY_ERR rc;
  char *uri_local;
  size_t prefix_len_local;
  char *prefix_local;
  lyxml_ctx *xmlctx_local;
  
  ns._4_4_ = LY_SUCCESS;
  pcStack_28 = uri;
  if ((xmlctx->ns).count != 0) {
    local_3c = (xmlctx->ns).count;
    do {
      local_3c = local_3c - 1;
      plVar1 = (xmlctx->ns).field_2.dnodes[local_3c];
      if (*(uint *)&plVar1->parent < (xmlctx->elements).count) break;
      if (((prefix != (char *)0x0) &&
          (lVar2._0_4_ = plVar1->hash, lVar2._4_4_ = plVar1->flags, lVar2 != 0)) &&
         (iVar5 = ly_strncmp(*(char **)plVar1,prefix,prefix_len), iVar5 == 0)) {
        iVar5 = strcmp((char *)plVar1->schema,uri);
        if (iVar5 != 0) {
          lVar3._0_4_ = plVar1->hash;
          lVar3._4_4_ = plVar1->flags;
          ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,
                  "Duplicate XML NS prefix \"%s\" used for namespaces \"%s\" and \"%s\".",lVar3,
                  plVar1->schema,uri);
          ns._4_4_ = LY_EVALID;
        }
        goto LAB_0020c4bc;
      }
      if ((prefix == (char *)0x0) &&
         (lVar4._0_4_ = plVar1->hash, lVar4._4_4_ = plVar1->flags, lVar4 == 0)) {
        iVar5 = strcmp((char *)plVar1->schema,uri);
        if (iVar5 != 0) {
          ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,
                  "Duplicate default XML namespaces \"%s\" and \"%s\".",plVar1->schema,uri);
          ns._4_4_ = LY_EVALID;
        }
        goto LAB_0020c4bc;
      }
    } while (local_3c != 0);
  }
  object = (long *)malloc(0x18);
  if (object == (long *)0x0) {
    ly_log(xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxml_ns_add");
    ns._4_4_ = LY_EMEM;
  }
  else {
    *(uint32_t *)(object + 2) = (xmlctx->elements).count;
    object[1] = (long)uri;
    if (prefix == (char *)0x0) {
      *object = 0;
    }
    else {
      pcVar6 = strndup(prefix,prefix_len);
      *object = (long)pcVar6;
      if (*object == 0) {
        ly_log(xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxml_ns_add");
        free(object);
        ns._4_4_ = LY_EMEM;
        goto LAB_0020c4bc;
      }
    }
    ns._4_4_ = ly_set_add(&xmlctx->ns,object,'\x01',(uint32_t *)0x0);
    if (ns._4_4_ == LY_SUCCESS) {
      pcStack_28 = (char *)0x0;
    }
    else {
      free((void *)*object);
      free(object);
    }
  }
LAB_0020c4bc:
  free(pcStack_28);
  return ns._4_4_;
}

Assistant:

LY_ERR
lyxml_ns_add(struct lyxml_ctx *xmlctx, const char *prefix, size_t prefix_len, char *uri)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyxml_ns *ns;
    uint32_t i;

    /* check for duplicates */
    if (xmlctx->ns.count) {
        i = xmlctx->ns.count;
        do {
            --i;
            ns = xmlctx->ns.objs[i];
            if (ns->depth < xmlctx->elements.count) {
                /* only namespaces of parents, no need to check further */
                break;
            } else if (prefix && ns->prefix && !ly_strncmp(ns->prefix, prefix, prefix_len)) {
                if (!strcmp(ns->uri, uri)) {
                    /* exact same prefix and namespace, ignore */
                    goto cleanup;
                }

                LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Duplicate XML NS prefix \"%s\" used for namespaces \"%s\" and \"%s\".",
                        ns->prefix, ns->uri, uri);
                rc = LY_EVALID;
                goto cleanup;
            } else if (!prefix && !ns->prefix) {
                if (!strcmp(ns->uri, uri)) {
                    /* exact same default namespace, ignore */
                    goto cleanup;
                }

                LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Duplicate default XML namespaces \"%s\" and \"%s\".", ns->uri, uri);
                rc = LY_EVALID;
                goto cleanup;
            }
        } while (i);
    }

    ns = malloc(sizeof *ns);
    LY_CHECK_ERR_GOTO(!ns, LOGMEM(xmlctx->ctx); rc = LY_EMEM, cleanup);

    /* we need to connect the depth of the element where the namespace is defined with the
     * namespace record to be able to maintain (remove) the record when the parser leaves
     * (to its sibling or back to the parent) the element where the namespace was defined */
    ns->depth = xmlctx->elements.count;

    ns->uri = uri;
    if (prefix) {
        ns->prefix = strndup(prefix, prefix_len);
        LY_CHECK_ERR_GOTO(!ns->prefix, LOGMEM(xmlctx->ctx); free(ns); rc = LY_EMEM, cleanup);
    } else {
        ns->prefix = NULL;
    }

    rc = ly_set_add(&xmlctx->ns, ns, 1, NULL);
    LY_CHECK_ERR_GOTO(rc, free(ns->prefix); free(ns), cleanup);

    /* successfully stored */
    uri = NULL;

cleanup:
    free(uri);
    return rc;
}